

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISConsole.cpp
# Opt level: O0

bool __thiscall EventHandler::povMoved(EventHandler *this,JoyStickEvent *arg,int pov)

{
  ostream *poVar1;
  string *psVar2;
  int in_EDX;
  long in_RSI;
  
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  psVar2 = OIS::Object::vendor_abi_cxx11_(*(Object **)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,". POV");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  std::operator<<(poVar1," ");
  if ((*(uint *)(*(long *)(in_RSI + 0x10) + 0x44 + (long)in_EDX * 8) & 1) == 0) {
    if ((*(uint *)(*(long *)(in_RSI + 0x10) + 0x44 + (long)in_EDX * 8) & 0x10) != 0) {
      std::operator<<((ostream *)&std::cout,"South");
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"North");
  }
  if ((*(uint *)(*(long *)(in_RSI + 0x10) + 0x44 + (long)in_EDX * 8) & 0x100) == 0) {
    if ((*(uint *)(*(long *)(in_RSI + 0x10) + 0x44 + (long)in_EDX * 8) & 0x1000) != 0) {
      std::operator<<((ostream *)&std::cout,"West");
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"East");
  }
  if (*(int *)(*(long *)(in_RSI + 0x10) + 0x44 + (long)in_EDX * 8) == 0) {
    std::operator<<((ostream *)&std::cout,"Centered");
  }
  return true;
}

Assistant:

bool povMoved(const JoyStickEvent& arg, int pov)
	{
		std::cout << std::endl
				  << arg.device->vendor() << ". POV" << pov << " ";

		if(arg.state.mPOV[pov].direction & Pov::North) //Going up
			std::cout << "North";
		else if(arg.state.mPOV[pov].direction & Pov::South) //Going down
			std::cout << "South";

		if(arg.state.mPOV[pov].direction & Pov::East) //Going right
			std::cout << "East";
		else if(arg.state.mPOV[pov].direction & Pov::West) //Going left
			std::cout << "West";

		if(arg.state.mPOV[pov].direction == Pov::Centered) //stopped/centered out
			std::cout << "Centered";
		return true;
	}